

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

fxp_xfer * xfer_download_init(fxp_handle *fh,uint64_t offset)

{
  fxp_xfer *xfer_00;
  fxp_xfer *xfer;
  uint64_t offset_local;
  fxp_handle *fh_local;
  
  xfer_00 = xfer_init(fh,offset);
  xfer_00->eof = false;
  xfer_download_queue(xfer_00);
  return xfer_00;
}

Assistant:

struct fxp_xfer *xfer_download_init(struct fxp_handle *fh, uint64_t offset)
{
    struct fxp_xfer *xfer = xfer_init(fh, offset);

    xfer->eof = false;
    xfer_download_queue(xfer);

    return xfer;
}